

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH_errorcode
XXH3_generateSecret(void *secretBuffer,size_t secretSize,void *customSeed,size_t customSeedSize)

{
  void *in_RCX;
  xxh_u8 *in_RDX;
  ulong in_RSI;
  long in_RDI;
  XXH128_hash_t XVar1;
  XXH128_hash_t h128;
  XXH128_canonical_t scrambler;
  size_t n;
  size_t nbSeg16;
  size_t toCopy;
  size_t pos;
  size_t in_stack_ffffffffffffff68;
  void *in_stack_ffffffffffffff70;
  void *__n;
  XXH128_hash_t in_stack_ffffffffffffff78;
  ulong local_48;
  ulong local_30;
  void *local_28;
  xxh_u8 *local_20;
  XXH_errorcode local_4;
  
  if (in_RDI == 0) {
    local_4 = XXH_ERROR;
  }
  else if (in_RSI < 0x88) {
    local_4 = XXH_ERROR;
  }
  else {
    local_28 = in_RCX;
    local_20 = in_RDX;
    if (in_RCX == (void *)0x0) {
      local_20 = XXH3_kSecret;
      local_28 = (void *)0xc0;
    }
    if (local_20 == (xxh_u8 *)0x0) {
      local_4 = XXH_ERROR;
    }
    else {
      for (local_30 = 0; local_30 < in_RSI; local_30 = (long)__n + local_30) {
        __n = local_28;
        if ((void *)(in_RSI - local_30) <= local_28) {
          __n = (void *)(in_RSI - local_30);
        }
        in_stack_ffffffffffffff70 = __n;
        memcpy((void *)(in_RDI + local_30),local_20,(size_t)__n);
      }
      XXH128(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0x109ea4);
      XVar1.high64 = (XXH64_hash_t)in_stack_ffffffffffffff70;
      XVar1.low64 = in_stack_ffffffffffffff68;
      XXH128_canonicalFromHash((XXH128_canonical_t *)0x109ec2,XVar1);
      for (local_48 = 0; local_48 < in_RSI >> 4; local_48 = local_48 + 1) {
        XXH128(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0x109eeb);
        XXH3_combine16(in_stack_ffffffffffffff70,in_stack_ffffffffffffff78);
      }
      XVar1 = XXH128_hashFromCanonical((XXH128_canonical_t *)0x109f4a);
      XXH3_combine16(in_stack_ffffffffffffff70,XVar1);
      local_4 = XXH_OK;
    }
  }
  return local_4;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode
XXH3_generateSecret(XXH_NOESCAPE void* secretBuffer, size_t secretSize, XXH_NOESCAPE const void* customSeed, size_t customSeedSize)
{
#if (XXH_DEBUGLEVEL >= 1)
    XXH_ASSERT(secretBuffer != NULL);
    XXH_ASSERT(secretSize >= XXH3_SECRET_SIZE_MIN);
#else
    /* production mode, assert() are disabled */
    if (secretBuffer == NULL) return XXH_ERROR;
    if (secretSize < XXH3_SECRET_SIZE_MIN) return XXH_ERROR;
#endif

    if (customSeedSize == 0) {
        customSeed = XXH3_kSecret;
        customSeedSize = XXH_SECRET_DEFAULT_SIZE;
    }
#if (XXH_DEBUGLEVEL >= 1)
    XXH_ASSERT(customSeed != NULL);
#else
    if (customSeed == NULL) return XXH_ERROR;
#endif

    /* Fill secretBuffer with a copy of customSeed - repeat as needed */
    {   size_t pos = 0;
        while (pos < secretSize) {
            size_t const toCopy = XXH_MIN((secretSize - pos), customSeedSize);
            memcpy((char*)secretBuffer + pos, customSeed, toCopy);
            pos += toCopy;
    }   }

    {   size_t const nbSeg16 = secretSize / 16;
        size_t n;
        XXH128_canonical_t scrambler;
        XXH128_canonicalFromHash(&scrambler, XXH128(customSeed, customSeedSize, 0));
        for (n=0; n<nbSeg16; n++) {
            XXH128_hash_t const h128 = XXH128(&scrambler, sizeof(scrambler), n);
            XXH3_combine16((char*)secretBuffer + n*16, h128);
        }
        /* last segment */
        XXH3_combine16((char*)secretBuffer + secretSize - 16, XXH128_hashFromCanonical(&scrambler));
    }
    return XXH_OK;
}